

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O2

comm * __thiscall mxx::comm::split(comm *__return_storage_ptr__,comm *this,int color)

{
  comm(__return_storage_ptr__);
  MPI_Comm_split(this->mpi_comm,color,this->m_rank,&__return_storage_ptr__->mpi_comm);
  init_ranksize(__return_storage_ptr__);
  __return_storage_ptr__->do_free = true;
  return __return_storage_ptr__;
}

Assistant:

comm split(int color) const {
        comm o;
        MPI_Comm_split(this->mpi_comm, color, this->rank(), &o.mpi_comm);
        o.init_ranksize();
        o.do_free = true;
        return o;
    }